

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O3

int libj1939_socket_prio(int sock,int prio)

{
  int iVar1;
  int iVar2;
  int local_10;
  int local_c;
  
  local_10 = prio;
  iVar1 = setsockopt(sock,0x6b,3,&local_10,4);
  iVar2 = 0;
  if (iVar1 < 0) {
    libj1939_socket_prio_cold_1();
    iVar2 = local_c;
  }
  return iVar2;
}

Assistant:

int libj1939_socket_prio(int sock, int prio)
{
	int ret;

	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_SEND_PRIO,
			 &prio, sizeof(prio));
	if (ret < 0) {
		ret = -errno;
		pr_warn("Failed to set priority %i. Error %i (%s)", prio, ret,
			strerror(ret));
		return ret;
	}

	return 0;
}